

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O1

int obfuscate_object(int otyp)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  
  if (otyp == 0) {
    return 0;
  }
  iVar2 = otyp + -1;
  if ((objects[iVar2].field_0x10 & 1) == 0) {
    if (otyp - 0x1f1U < 0x16) {
      bVar1 = objects[iVar2].oc_color;
      if ((bVar1 < 0x10) && ((0x8a3fU >> (bVar1 & 0x1f) & 1) != 0)) {
        iVar2 = *(int *)(&DAT_002a2808 + (ulong)(ushort)bVar1 * 4);
      }
    }
    else {
      uVar3 = otyp - 0xdf;
      if (uVar3 < 0x1e) {
        if ((0xfU >> (uVar3 & 0x1f) & 1) != 0) {
          iVar2 = 0xde;
          goto LAB_0016c6cf;
        }
        if ((0xc00U >> (uVar3 & 0x1f) & 1) != 0) {
          iVar2 = 0xe8;
          goto LAB_0016c6cf;
        }
        if ((0x30000000U >> (uVar3 & 0x1f) & 1) != 0) {
          iVar2 = 0xfa;
          goto LAB_0016c6cf;
        }
      }
      if (otyp - 0x210U < 4) {
        iVar2 = 0x212;
      }
    }
  }
LAB_0016c6cf:
  return objects[iVar2].oc_descr_idx + 1;
}

Assistant:

int obfuscate_object(int otyp)
{
    if (!otyp)
	return 0;
    
    /* object ids are shifted by 1 for display, so that 0 can mean "no object" */
    otyp -= 1;
    
    if (!objects[otyp].oc_name_known) {
	switch (otyp) {
	    case SACK: case OILSKIN_SACK: case BAG_OF_TRICKS: case BAG_OF_HOLDING:
		otyp = SACK; break;

	    case LOADSTONE: case LUCKSTONE: case FLINT: case TOUCHSTONE: 
		otyp = FLINT; break;

	    case OIL_LAMP: case MAGIC_LAMP:
		otyp = OIL_LAMP; break;

	    case TIN_WHISTLE: case MAGIC_WHISTLE:
		otyp = TIN_WHISTLE; break;

	    /* all gems initially look like pieces of glass */
	    case DILITHIUM_CRYSTAL: case DIAMOND: case RUBY: case JACINTH:
	    case SAPPHIRE: case BLACK_OPAL: case EMERALD: case TURQUOISE:
	    case CITRINE: case AQUAMARINE: case AMBER: case TOPAZ: case JET:
	    case OPAL: case CHRYSOBERYL: case GARNET: case AMETHYST: case JASPER:
	    case FLUORITE: case OBSIDIAN: case AGATE: case JADE:
		switch (objects[otyp].oc_color) {
		    case CLR_WHITE: otyp = WORTHLESS_PIECE_OF_WHITE_GLASS; break;
		    case CLR_BLUE: otyp = WORTHLESS_PIECE_OF_BLUE_GLASS; break;
		    case CLR_RED: otyp = WORTHLESS_PIECE_OF_RED_GLASS; break;
		    case CLR_BROWN: otyp = WORTHLESS_PIECE_OF_YELLOWISH_BROWN_GLASS; break;
		    case CLR_ORANGE: otyp = WORTHLESS_PIECE_OF_ORANGE_GLASS; break;
		    case CLR_YELLOW: otyp = WORTHLESS_PIECE_OF_YELLOW_GLASS; break;
		    case CLR_BLACK: otyp = WORTHLESS_PIECE_OF_BLACK_GLASS; break;
		    case CLR_GREEN: otyp = WORTHLESS_PIECE_OF_GREEN_GLASS; break;
		    case CLR_MAGENTA: otyp = WORTHLESS_PIECE_OF_VIOLET_GLASS; break;
		}
		break;
	}
    }

    /* finally, account for shuffled descriptions */
    return objects[otyp].oc_descr_idx + 1;
}